

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O1

uint64 mkvmuxer::EbmlElementSize(uint64 type,float param_2)

{
  uint64 uVar1;
  
  uVar1 = 6;
  if ((((0xff < type) && (uVar1 = 7, 0xffff < type)) && (uVar1 = 8, 0xffffff < type)) &&
     (((uVar1 = 9, type >> 0x20 != 0 && (uVar1 = 10, type >> 0x28 != 0)) &&
      (uVar1 = 0xb, type >> 0x30 != 0)))) {
    uVar1 = 0xd - (ulong)(type >> 0x38 == 0);
  }
  return uVar1;
}

Assistant:

uint64 EbmlElementSize(uint64 type, float /* value */) {
  // Size of EBML ID
  uint64 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += sizeof(float);

  // Size of Datasize
  ebml_size++;

  return ebml_size;
}